

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanHppGenerator.cpp
# Opt level: O0

string * anon_unknown.dwarf_b1723::readSnippet(string *__return_storage_ptr__,string *snippetFile)

{
  byte bVar1;
  streambuf *psVar2;
  ostringstream local_410 [8];
  ostringstream oss;
  allocator<char> local_281;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_280;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_260;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_240;
  undefined1 local_220 [8];
  ifstream ifs;
  string *snippetFile_local;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_280,
             "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp",
             &local_281);
  std::operator+(&local_260,&local_280,"/snippets/");
  std::operator+(&local_240,&local_260,snippetFile);
  std::ifstream::ifstream(local_220,&local_240,8);
  std::__cxx11::string::~string((string *)&local_240);
  std::__cxx11::string::~string((string *)&local_260);
  std::__cxx11::string::~string((string *)&local_280);
  std::allocator<char>::~allocator(&local_281);
  bVar1 = std::ios::fail();
  if (((bVar1 ^ 0xff) & 1) == 0) {
    __assert_fail("!ifs.fail()",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/VulkanHppGenerator.cpp"
                  ,0x42d2,"std::string (anonymous namespace)::readSnippet(const std::string &)");
  }
  std::__cxx11::ostringstream::ostringstream(local_410);
  psVar2 = (streambuf *)std::ifstream::rdbuf();
  std::ostream::operator<<((ostream *)local_410,psVar2);
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_410);
  std::ifstream::~ifstream(local_220);
  return __return_storage_ptr__;
}

Assistant:

std::string readSnippet( std::string const & snippetFile )
  {
    std::ifstream ifs( std::string( BASE_PATH ) + "/snippets/" + snippetFile );
    assert( !ifs.fail() );
    std::ostringstream oss;
    oss << ifs.rdbuf();
    return oss.str();
  }